

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_51301::DebugExpr::parse_non_term(DebugExpr *this,Context *param_1)

{
  if ((this->fn).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->fn)._M_invoker)((_Any_data *)&this->fn);
    return true;
  }
  std::__throw_bad_function_call();
}

Assistant:

virtual bool parse_non_term(Context &) const
	{
		fn();
		return true;
	}